

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptorProto::Clear(FileDescriptorProto *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_58;
  Voidify local_45 [20];
  byte local_31;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  FileDescriptorProto *pFStack_18;
  uint32_t cached_has_bits;
  FileDescriptorProto *this_local;
  
  this_local = (FileDescriptorProto *)&this->field_0;
  local_1c = 0;
  pFStack_18 = this;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.dependency_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::Clear(&(this->field_0)._impl_.message_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Clear(&(this->field_0)._impl_.enum_type_)
  ;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::Clear
            (&(this->field_0)._impl_.service_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Clear
            (&(this->field_0)._impl_.extension_);
  RepeatedField<int>::Clear(&(this->field_0)._impl_.public_dependency_);
  RepeatedField<int>::Clear(&(this->field_0)._impl_.weak_dependency_);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.option_dependency_);
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 0x1f) != 0) {
    if ((local_1c & 1) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.name_);
    }
    if ((local_1c & 2) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.package_);
    }
    if ((local_1c & 4) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.syntax_);
    }
    if ((local_1c & 8) != 0) {
      local_31 = 0;
      if ((this->field_0)._impl_.options_ == (FileOptions *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0xb39,"_impl_.options_ != nullptr");
        local_31 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
      }
      if ((local_31 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      }
      FileOptions::Clear((this->field_0)._impl_.options_);
    }
    if ((local_1c & 0x10) != 0) {
      if ((this->field_0)._impl_.source_code_info_ == (SourceCodeInfo *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0xb3d,"_impl_.source_code_info_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
        absl::lts_20250127::log_internal::Voidify::operator&&(local_45,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_58);
      }
      SourceCodeInfo::Clear((this->field_0)._impl_.source_code_info_);
    }
  }
  (this->field_0)._impl_.edition_ = 0;
  internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void FileDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FileDescriptorProto)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.dependency_.Clear();
  _impl_.message_type_.Clear();
  _impl_.enum_type_.Clear();
  _impl_.service_.Clear();
  _impl_.extension_.Clear();
  _impl_.public_dependency_.Clear();
  _impl_.weak_dependency_.Clear();
  _impl_.option_dependency_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000001fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.name_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.package_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.syntax_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(_impl_.options_ != nullptr);
      _impl_.options_->Clear();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(_impl_.source_code_info_ != nullptr);
      _impl_.source_code_info_->Clear();
    }
  }
  _impl_.edition_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}